

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  long in_RSI;
  Mat *in_RDI;
  undefined1 *__arg;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *this_00;
  Mat *this_01;
  int *_elemsize;
  int in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4c;
  undefined1 in_stack_fffffffffffffc4d;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  int _c;
  Mat *this_02;
  Allocator *in_stack_fffffffffffffc60;
  int *in_stack_fffffffffffffd08;
  int *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  int *in_stack_fffffffffffffd20;
  Mat *in_stack_fffffffffffffd28;
  Crop *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd40;
  int *in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  int *in_stack_fffffffffffffd58;
  int local_280;
  int local_27c;
  Mat local_278;
  undefined1 local_230 [216];
  int local_158;
  undefined4 local_154;
  Mat local_150;
  undefined1 local_108 [88];
  Mat local_b0;
  int local_68;
  undefined1 local_64 [8];
  int local_5c;
  undefined1 local_54 [12];
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x38);
  local_3c = *(int *)(in_RSI + 0x28);
  local_48 = *(long *)(in_RSI + 0x10);
  local_5c = -1;
  local_64._4_4_ = -1;
  local_64._0_4_ = -1;
  this_02 = &local_b0;
  ncnn::Mat::shape((Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                   CONCAT16(in_stack_fffffffffffffc4e,
                                            CONCAT15(in_stack_fffffffffffffc4d,
                                                     CONCAT14(in_stack_fffffffffffffc4c,
                                                              in_stack_fffffffffffffc48)))));
  _elemsize = &local_68;
  this_01 = (Mat *)local_64;
  this_00 = (Mat *)(local_64 + 4);
  __arg = local_54;
  resolve_crop_roi(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                   in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
                   in_stack_fffffffffffffd58);
  ncnn::Mat::~Mat((Mat *)0x36911d);
  if (local_3c == 1) {
    if (local_5c == local_2c) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      ncnn::Mat::create(in_RDI,CONCAT13(in_stack_fffffffffffffc4f,
                                        CONCAT12(in_stack_fffffffffffffc4e,
                                                 CONCAT11(in_stack_fffffffffffffc4d,
                                                          in_stack_fffffffffffffc4c))),
                        (size_t)_elemsize,(Allocator *)this_01);
      bVar1 = ncnn::Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_48 == 1) {
          copy_cut_border_image<signed_char>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        if (local_48 == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        if (local_48 == 4) {
          copy_cut_border_image<float>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_3c == 2) {
    if ((local_5c == local_2c) && (local_64._4_4_ == local_30)) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      ncnn::Mat::create(in_RDI,CONCAT13(in_stack_fffffffffffffc4f,
                                        CONCAT12(in_stack_fffffffffffffc4e,
                                                 CONCAT11(in_stack_fffffffffffffc4d,
                                                          in_stack_fffffffffffffc4c))),
                        in_stack_fffffffffffffc48,(size_t)_elemsize,(Allocator *)this_01);
      bVar1 = ncnn::Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_48 == 1) {
          copy_cut_border_image<signed_char>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        if (local_48 == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        if (local_48 == 4) {
          copy_cut_border_image<float>
                    (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                            CONCAT16(in_stack_fffffffffffffc4e,
                                                     CONCAT15(in_stack_fffffffffffffc4d,
                                                              CONCAT14(in_stack_fffffffffffffc4c,
                                                                       in_stack_fffffffffffffc48))))
                     ,(int)((ulong)_elemsize >> 0x20),(int)_elemsize);
        }
        local_4 = 0;
      }
    }
  }
  else {
    _c = (int)((ulong)in_RDI >> 0x20);
    if (local_3c == 3) {
      if (((local_5c == local_2c) && (local_64._4_4_ == local_30)) && (local_68 == local_38)) {
        ncnn::Mat::operator=(this_01,this_00);
        local_4 = 0;
      }
      else {
        iVar3 = local_68;
        ncnn::Mat::channel_range(this_02,_c,(int)in_RDI);
        if ((local_5c == local_2c) && (local_64._4_4_ == local_30)) {
          ncnn::Mat::clone(&local_150,(__fn *)local_108,(void *)0x0,iVar3,__arg);
          ncnn::Mat::operator=(this_01,this_00);
          ncnn::Mat::~Mat((Mat *)0x369488);
          bVar1 = ncnn::Mat::empty(this_00);
          if (bVar1) {
            local_4 = -100;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          ncnn::Mat::create(in_RDI,CONCAT13(in_stack_fffffffffffffc4f,
                                            CONCAT12(in_stack_fffffffffffffc4e,
                                                     CONCAT11(in_stack_fffffffffffffc4d,
                                                              in_stack_fffffffffffffc4c))),
                            in_stack_fffffffffffffc48,(int)((ulong)_elemsize >> 0x20),
                            (size_t)this_01,(Allocator *)this_00);
          uVar2 = ncnn::Mat::empty(this_00);
          if ((bool)uVar2) {
            local_4 = -100;
          }
          else {
            for (local_158 = 0; local_158 < local_68; local_158 = local_158 + 1) {
              ncnn::Mat::channel(this_02,(int)((ulong)in_RDI >> 0x20));
              ncnn::Mat::channel(this_02,(int)((ulong)in_RDI >> 0x20));
              if (local_48 == 1) {
                copy_cut_border_image<signed_char>
                          (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                  CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffc4d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffc4c,
                                                  in_stack_fffffffffffffc48)))),
                           (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
              }
              if (local_48 == 2) {
                copy_cut_border_image<unsigned_short>
                          (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                  CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffc4d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffc4c,
                                                  in_stack_fffffffffffffc48)))),
                           (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
              }
              if (local_48 == 4) {
                copy_cut_border_image<float>
                          (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                  CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffc4d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffc4c,
                                                  in_stack_fffffffffffffc48)))),
                           (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
              }
              ncnn::Mat::~Mat((Mat *)0x3696c7);
              ncnn::Mat::~Mat((Mat *)0x3696d4);
            }
            local_4 = 0;
          }
        }
        local_154 = 1;
        ncnn::Mat::~Mat((Mat *)0x36971c);
      }
    }
    else if (local_3c == 4) {
      if ((((local_5c == local_2c) && (local_64._4_4_ == local_30)) && (local_64._0_4_ == local_34))
         && (local_68 == local_38)) {
        ncnn::Mat::operator=(this_01,this_00);
        local_4 = 0;
      }
      else {
        iVar3 = local_68;
        ncnn::Mat::channel_range(this_02,_c,(int)in_RDI);
        if (((local_5c == local_2c) && (local_64._4_4_ == local_30)) && (local_64._0_4_ == local_34)
           ) {
          ncnn::Mat::clone(&local_278,(__fn *)local_230,(void *)0x0,iVar3,__arg);
          ncnn::Mat::operator=(this_01,this_00);
          ncnn::Mat::~Mat((Mat *)0x369844);
          bVar1 = ncnn::Mat::empty(this_00);
          if (bVar1) {
            local_4 = -100;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          ncnn::Mat::create(in_RDI,CONCAT13(in_stack_fffffffffffffc4f,
                                            CONCAT12(in_stack_fffffffffffffc4e,
                                                     CONCAT11(in_stack_fffffffffffffc4d,
                                                              in_stack_fffffffffffffc4c))),
                            in_stack_fffffffffffffc48,(int)((ulong)_elemsize >> 0x20),(int)_elemsize
                            ,(size_t)this_01,in_stack_fffffffffffffc60);
          uVar2 = ncnn::Mat::empty(this_00);
          if ((bool)uVar2) {
            local_4 = -100;
          }
          else {
            for (local_27c = 0; local_27c < local_68; local_27c = local_27c + 1) {
              for (local_280 = 0; local_280 < (int)local_64._0_4_; local_280 = local_280 + 1) {
                ncnn::Mat::channel(this_02,(int)((ulong)in_RDI >> 0x20));
                ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
                ncnn::Mat::~Mat((Mat *)0x3699e4);
                ncnn::Mat::channel(this_02,(int)((ulong)in_RDI >> 0x20));
                ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
                ncnn::Mat::~Mat((Mat *)0x369a24);
                if (local_48 == 1) {
                  copy_cut_border_image<signed_char>
                            (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                    CONCAT16(in_stack_fffffffffffffc4e,
                                                             CONCAT15(in_stack_fffffffffffffc4d,
                                                                      CONCAT14(uVar2,
                                                  in_stack_fffffffffffffc48)))),
                             (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
                }
                if (local_48 == 2) {
                  copy_cut_border_image<unsigned_short>
                            (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                    CONCAT16(in_stack_fffffffffffffc4e,
                                                             CONCAT15(in_stack_fffffffffffffc4d,
                                                                      CONCAT14(uVar2,
                                                  in_stack_fffffffffffffc48)))),
                             (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
                }
                if (local_48 == 4) {
                  copy_cut_border_image<float>
                            (in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffc4f,
                                                    CONCAT16(in_stack_fffffffffffffc4e,
                                                             CONCAT15(in_stack_fffffffffffffc4d,
                                                                      CONCAT14(uVar2,
                                                  in_stack_fffffffffffffc48)))),
                             (int)((ulong)_elemsize >> 0x20),(int)_elemsize);
                }
                ncnn::Mat::~Mat((Mat *)0x369b56);
                ncnn::Mat::~Mat((Mat *)0x369b63);
              }
            }
            local_4 = 0;
          }
        }
        local_154 = 1;
        ncnn::Mat::~Mat((Mat *)0x369bc3);
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}